

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparser.cpp
# Opt level: O0

int __thiscall argparser::getopt(argparser *this,int ___argc,char **___argv,char *__shortopts)

{
  uint uVar1;
  string *psVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 in_register_00000034;
  size_t pos;
  option *opt;
  int retval;
  string arg;
  string local_90 [32];
  ulong local_70;
  char **local_68;
  int local_5c;
  undefined4 local_58;
  string local_48 [32];
  char *local_28;
  char **local_20;
  string *local_18;
  argparser *local_10;
  int local_4;
  
  local_18 = (string *)CONCAT44(in_register_00000034,___argc);
  uVar1 = this->optind;
  local_28 = __shortopts;
  local_20 = ___argv;
  local_10 = this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(this->argv).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
  if (uVar1 == sVar4) {
    return -1;
  }
  std::__cxx11::string::string(local_48);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->argv).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ,(ulong)this->optind);
  std::__cxx11::string::operator=(local_48,(string *)pvVar5);
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
  if ((*pcVar6 != '-') ||
     ((pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar6 == '-' &&
      (lVar7 = std::__cxx11::string::size(), lVar7 == 1)))) {
    local_4 = -1;
    goto LAB_001d8411;
  }
  this->optind = this->optind + 1;
  local_5c = 0x3f;
  iVar3 = std::__cxx11::string::compare((ulong)local_48,0,(char *)0x2);
  if (iVar3 == 0) {
    lVar7 = std::__cxx11::string::size();
    if (lVar7 == 2) {
      local_4 = -1;
      goto LAB_001d8411;
    }
    for (local_68 = local_20; *local_68 != (char *)0x0; local_68 = local_68 + 4) {
      iVar3 = std::__cxx11::string::compare((ulong)local_48,2,(char *)0xffffffffffffffff);
      if (iVar3 == 0) {
        local_5c = *(int *)(local_68 + 3);
        if (*(int *)(local_68 + 1) != 0) {
          uVar1 = this->optind;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&(this->argv).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        );
          if (uVar1 < sVar4) {
            uVar1 = this->optind;
            this->optind = uVar1 + 1;
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&(this->argv).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ,(ulong)uVar1);
            uVar8 = std::__cxx11::string::operator=((string *)this,(string *)pvVar5);
            pcVar6 = (char *)std::__cxx11::string::operator[](uVar8);
            if (*pcVar6 != '-') goto LAB_001d8165;
          }
          std::__cxx11::string::clear();
          this->optind = this->optind - 1;
          if (*(int *)(local_68 + 1) == 1) {
            local_5c = 0x3a;
          }
        }
LAB_001d8165:
        if (local_68[2] != (char *)0x0) {
          *(undefined4 *)local_68[2] = *(undefined4 *)(local_68 + 3);
          local_5c = 0;
        }
        break;
      }
    }
  }
  else if ((local_18 != (string *)0x0) &&
          (iVar3 = std::__cxx11::string::compare((ulong)local_48,0,(char *)0x1), psVar2 = local_18,
          iVar3 == 0)) {
    std::__cxx11::string::substr((ulong)local_90,(ulong)local_48);
    uVar8 = std::__cxx11::string::find(psVar2,(ulong)local_90);
    std::__cxx11::string::~string(local_90);
    local_70 = uVar8;
    if (uVar8 != 0xffffffffffffffff) {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      uVar8 = local_70;
      local_5c = (int)*pcVar6;
      uVar9 = std::__cxx11::string::length();
      if (uVar8 < uVar9) {
        local_70 = local_70 + 1;
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
        if ((*pcVar6 == ':') ||
           (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_18), *pcVar6 == ';')) {
          uVar1 = this->optind;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&(this->argv).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        );
          if (uVar1 < sVar4) {
            uVar1 = this->optind;
            this->optind = uVar1 + 1;
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&(this->argv).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ,(ulong)uVar1);
            uVar8 = std::__cxx11::string::operator=((string *)this,(string *)pvVar5);
            pcVar6 = (char *)std::__cxx11::string::operator[](uVar8);
            if (*pcVar6 != '-') goto LAB_001d83f8;
          }
          std::__cxx11::string::clear();
          this->optind = this->optind - 1;
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
          if (*pcVar6 == ':') {
            local_5c = 0x3a;
          }
        }
      }
    }
  }
LAB_001d83f8:
  local_4 = local_5c;
LAB_001d8411:
  local_58 = 1;
  std::__cxx11::string::~string(local_48);
  return local_4;
}

Assistant:

int
argparser::getopt(string* shortopts, const struct option* longopts,
                  int* /*longindex*/)
{
    if (optind == argv.size())
        return -1;

    string arg;
    arg = argv[optind];
    if (arg[0] != '-' || (arg[0] == '-' && arg.size() == 1))
        return -1;
    optind++;

    int retval = '?';
    if (arg.compare(0, 2, "--") == 0) {
        if (arg.size() == 2) return -1; // " -- " separates options and files
        const struct option* opt = longopts;
        while (opt->name != nullptr) {
            if (arg.compare(2, string::npos, opt->name) == 0) {
                retval = opt->val;
                if (opt->has_arg != option::no_argument) {
                    if (optind >= argv.size() || (optarg = argv[optind++])[0] == '-') {
                        optarg.clear();
                        optind--;
                        if (opt->has_arg == option::required_argument)
                            retval = ':';
                    }
                }
                if (opt->flag != nullptr) {
                    *opt->flag = opt->val;
                    retval = 0;
                }
                break;
            }
            opt++;
        }
    } else if (shortopts != nullptr && arg.compare(0, 1, "-") == 0) {
        size_t pos = shortopts->find(arg.substr(1, 1));
        if (pos != string::npos) {
            retval = (*shortopts)[pos];
            if (pos < shortopts->length()
                && ((*shortopts)[++pos] == ':' || (*shortopts)[pos] == ';')) {
                if (optind >= argv.size() || (optarg = argv[optind++])[0] == '-') {
                    optarg.clear();
                    optind--;
                    if ((*shortopts)[pos] == ':') // required argument
                    retval = ':';
                }
            }
        }
    }

    return retval;
}